

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

vec3 dja::rotate(vec3 *r,vec3 *axis,float_t rad)

{
  float_t b;
  double dVar1;
  vec3 vVar2;
  vec3 local_f0;
  vec3 local_e0;
  vec3 local_d0;
  vec3 local_c0;
  vec3 local_b0;
  vec3 local_a0;
  vec3 local_90;
  undefined1 local_80 [8];
  vec3 r3;
  float_t fStack_6c;
  float_t local_68;
  undefined1 local_60 [8];
  vec3 r2;
  float_t fStack_4c;
  float_t local_48;
  undefined1 local_40 [8];
  vec3 r1;
  float_t s;
  float_t c;
  float_t rad_local;
  vec3 *axis_local;
  vec3 *r_local;
  
  dVar1 = std::cos((double)(ulong)(uint)rad);
  r1.z = SUB84(dVar1,0);
  dVar1 = std::sin((double)(ulong)(uint)rad);
  r1.y = SUB84(dVar1,0);
  b = dot(r,axis);
  vVar2 = operator*(axis,b);
  local_48 = vVar2.z;
  r1.x = local_48;
  stack0xffffffffffffffb0 = vVar2._0_8_;
  local_40._0_4_ = r2.z;
  local_40._4_4_ = fStack_4c;
  unique0x10000126 = vVar2;
  vVar2 = operator-(r,(vec3 *)local_40);
  local_68 = vVar2.z;
  r2.x = local_68;
  stack0xffffffffffffff90 = vVar2._0_8_;
  local_60._0_4_ = r3.z;
  local_60._4_4_ = fStack_6c;
  unique0x1000011a = vVar2;
  vVar2 = cross((vec3 *)local_60,axis);
  local_90.z = vVar2.z;
  r3.x = local_90.z;
  local_90._0_8_ = vVar2._0_8_;
  local_80._0_4_ = local_90.x;
  local_80._4_4_ = local_90.y;
  local_90 = vVar2;
  vVar2 = operator*(r1.z,(vec3 *)local_60);
  local_c0.z = vVar2.z;
  local_b0.z = local_c0.z;
  local_c0._0_8_ = vVar2._0_8_;
  local_b0.x = local_c0.x;
  local_b0.y = local_c0.y;
  local_c0 = vVar2;
  vVar2 = operator*(r1.y,(vec3 *)local_80);
  local_e0.z = vVar2.z;
  local_d0.z = local_e0.z;
  local_e0._0_8_ = vVar2._0_8_;
  local_d0.x = local_e0.x;
  local_d0.y = local_e0.y;
  vVar2 = operator-(&local_b0,&local_d0);
  local_f0.z = vVar2.z;
  local_a0.z = local_f0.z;
  local_f0._0_8_ = vVar2._0_8_;
  local_a0.x = local_f0.x;
  local_a0.y = local_f0.y;
  vVar2 = operator+(&local_a0,(vec3 *)local_40);
  return vVar2;
}

Assistant:

V3 rotate(const V3& r, const V3& axis, const V1 rad) {
    V1 c = cos(rad), s = sin(rad);
    V3 r1 = axis * dot(r, axis);
    V3 r2 = r - r1;
    V3 r3 = cross(r2, axis);

    return c * r2 - s * r3 + r1;
}